

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCastErrorMessage::Operation<duckdb::string_t,duckdb::date_t>
          (TryCastErrorMessage *this,string_t input,date_t *result,CastParameters *parameters)

{
  string_t str;
  string_t str_00;
  DateCastResult DVar1;
  char *buf;
  char *pcVar2;
  bool special;
  idx_t pos;
  bool local_49;
  undefined8 local_48;
  _Alloc_hider in_stack_ffffffffffffffc8;
  char local_28 [16];
  idx_t local_18;
  
  pcVar2 = input.value._0_8_;
  local_49 = false;
  buf = (char *)((long)&local_48 + 4);
  if (0xc < ((ulong)this & 0xffffffff)) {
    buf = pcVar2;
  }
  local_48 = this;
  DVar1 = Date::TryConvertDate
                    (buf,(ulong)this & 0xffffffff,&local_18,input.value._8_8_,&local_49,
                     SUB41(result[2].days,0));
  if (DVar1 == ERROR_RANGE) {
    str_00.value.pointer.ptr = in_stack_ffffffffffffffc8._M_p;
    str_00.value._0_8_ = pcVar2;
    Date::RangeError_abi_cxx11_(str_00);
    HandleCastError::AssignError((string *)&stack0xffffffffffffffc8,(CastParameters *)result);
  }
  else {
    if (DVar1 != ERROR_INCORRECT_FORMAT) {
      return true;
    }
    str.value.pointer.ptr = in_stack_ffffffffffffffc8._M_p;
    str.value._0_8_ = pcVar2;
    Date::FormatError_abi_cxx11_(str);
    HandleCastError::AssignError((string *)&stack0xffffffffffffffc8,(CastParameters *)result);
  }
  if (in_stack_ffffffffffffffc8._M_p != local_28) {
    operator_delete(in_stack_ffffffffffffffc8._M_p);
  }
  return false;
}

Assistant:

bool TryCastErrorMessage::Operation(string_t input, date_t &result, CastParameters &parameters) {
	idx_t pos;
	bool special = false;
	switch (Date::TryConvertDate(input.GetData(), input.GetSize(), pos, result, special, parameters.strict)) {
	case DateCastResult::SUCCESS:
		break;
	case DateCastResult::ERROR_INCORRECT_FORMAT:
		HandleCastError::AssignError(Date::FormatError(input), parameters);
		return false;
	case DateCastResult::ERROR_RANGE:
		HandleCastError::AssignError(Date::RangeError(input), parameters);
		return false;
	}
	return true;
}